

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue.hpp
# Opt level: O3

void libtorrent::heterogeneous_queue<libtorrent::alert>::move<libtorrent::torrent_conflict_alert>
               (char *dst,char *src)

{
  int *piVar1;
  long *plVar2;
  undefined8 uVar3;
  int iVar4;
  
  *(undefined8 *)(dst + 8) = *(undefined8 *)(src + 8);
  *(undefined ***)dst = &PTR__torrent_alert_004dc350;
  uVar3 = *(undefined8 *)(src + 0x18);
  *(undefined8 *)(dst + 0x10) = *(undefined8 *)(src + 0x10);
  *(undefined8 *)(dst + 0x18) = uVar3;
  src[0x10] = '\0';
  src[0x11] = '\0';
  src[0x12] = '\0';
  src[0x13] = '\0';
  src[0x14] = '\0';
  src[0x15] = '\0';
  src[0x16] = '\0';
  src[0x17] = '\0';
  src[0x18] = '\0';
  src[0x19] = '\0';
  src[0x1a] = '\0';
  src[0x1b] = '\0';
  src[0x1c] = '\0';
  src[0x1d] = '\0';
  src[0x1e] = '\0';
  src[0x1f] = '\0';
  *(undefined4 *)(dst + 0x28) = *(undefined4 *)(src + 0x28);
  *(undefined8 *)(dst + 0x20) = *(undefined8 *)(src + 0x20);
  *(undefined ***)dst = &PTR__torrent_conflict_alert_004de0a8;
  uVar3 = *(undefined8 *)(src + 0x38);
  *(undefined8 *)(dst + 0x30) = *(undefined8 *)(src + 0x30);
  *(undefined8 *)(dst + 0x38) = uVar3;
  src[0x30] = '\0';
  src[0x31] = '\0';
  src[0x32] = '\0';
  src[0x33] = '\0';
  src[0x34] = '\0';
  src[0x35] = '\0';
  src[0x36] = '\0';
  src[0x37] = '\0';
  src[0x38] = '\0';
  src[0x39] = '\0';
  src[0x3a] = '\0';
  src[0x3b] = '\0';
  src[0x3c] = '\0';
  src[0x3d] = '\0';
  src[0x3e] = '\0';
  src[0x3f] = '\0';
  dst[0x48] = '\0';
  dst[0x49] = '\0';
  dst[0x4a] = '\0';
  dst[0x4b] = '\0';
  dst[0x4c] = '\0';
  dst[0x4d] = '\0';
  dst[0x4e] = '\0';
  dst[0x4f] = '\0';
  uVar3 = *(undefined8 *)(src + 0x48);
  src[0x48] = '\0';
  src[0x49] = '\0';
  src[0x4a] = '\0';
  src[0x4b] = '\0';
  src[0x4c] = '\0';
  src[0x4d] = '\0';
  src[0x4e] = '\0';
  src[0x4f] = '\0';
  *(undefined8 *)(dst + 0x40) = *(undefined8 *)(src + 0x40);
  *(undefined8 *)(dst + 0x48) = uVar3;
  src[0x40] = '\0';
  src[0x41] = '\0';
  src[0x42] = '\0';
  src[0x43] = '\0';
  src[0x44] = '\0';
  src[0x45] = '\0';
  src[0x46] = '\0';
  src[0x47] = '\0';
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(src + 0x48) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(src + 0x48));
    plVar2 = *(long **)(src + 0x38);
    if (plVar2 != (long *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)((long)plVar2 + 0xc);
        iVar4 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar4 = *(int *)((long)plVar2 + 0xc);
        *(int *)((long)plVar2 + 0xc) = iVar4 + -1;
      }
      if (iVar4 == 1) {
        (**(code **)(*plVar2 + 0x18))();
      }
    }
  }
  *(undefined ***)src = &PTR__torrent_alert_004dc350;
  plVar2 = *(long **)(src + 0x18);
  if (plVar2 != (long *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar1 = (int *)((long)plVar2 + 0xc);
      iVar4 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = *(int *)((long)plVar2 + 0xc);
      *(int *)((long)plVar2 + 0xc) = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (**(code **)(*plVar2 + 0x18))();
    }
  }
  alert::~alert((alert *)src);
  return;
}

Assistant:

static void move(char* dst, char* src) noexcept
		{
			static_assert(std::is_nothrow_move_constructible<U>::value
				, "heterogeneous queue only supports noexcept move constructible types");
			static_assert(std::is_nothrow_destructible<U>::value
				, "heterogeneous queue only supports noexcept destructible types");
			U& rhs = *reinterpret_cast<U*>(src);

			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(dst) & (alignof(U) - 1)) == 0);

			new (dst) U(std::move(rhs));
			rhs.~U();
		}